

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O0

void DataLoader_Deinit(DATA_LOADER *dLoader)

{
  DATA_LOADER *dLoader_local;
  
  if (dLoader != (DATA_LOADER *)0x0) {
    DataLoader_Reset(dLoader);
    if (dLoader->_context != (void *)0x0) {
      if (dLoader->_callbacks->ddeinit == (DLOADCB_GEN_CALL)0x0) {
        free(dLoader->_context);
      }
      else {
        (*dLoader->_callbacks->ddeinit)(dLoader->_context);
      }
    }
    free(dLoader);
  }
  return;
}

Assistant:

void DataLoader_Deinit(DATA_LOADER *dLoader)
{
	if(dLoader == NULL) return;
	DataLoader_Reset(dLoader);
	if(dLoader->_context != NULL)
	{
		if (dLoader->_callbacks->ddeinit)
			dLoader->_callbacks->ddeinit(dLoader->_context);
		else
			free(dLoader->_context);
	}
	free(dLoader);
}